

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumDescriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long lVar3;
  undefined1 *puVar4;
  size_type sVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int iVar8;
  long *plVar9;
  char **ppcVar10;
  size_type *psVar11;
  long *plVar12;
  size_type sVar13;
  string prefix;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_","");
  paVar1 = &local_f0.field_2;
  lVar3 = **(long **)(descriptor + 8);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,lVar3,(*(long **)(descriptor + 8))[1] + lVar3);
  if (*(Descriptor **)(descriptor + 0x18) == (Descriptor *)0x0) {
    iVar8 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar8 == 0) {
      anon_unknown_0::ResolveKeyword(&local_b0,&local_f0);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_f0.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_f0._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_f0.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_f0._M_string_length;
    goto LAB_0028d3dd;
  }
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&local_b0,*(Descriptor **)(descriptor + 0x18),&local_90);
  iVar8 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar8 == 0) {
    ppcVar10 = std::
               __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,&local_f0);
    if (ppcVar10 == (char **)&ruby::Generator::vtable) goto LAB_0028d133;
    std::operator+(&local_50,"getattr(",&local_b0);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_60 = *plVar12;
      lStack_58 = plVar9[3];
    }
    else {
      local_60 = *plVar12;
      local_70 = (long *)*plVar9;
    }
    local_68 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar9[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      lVar3 = plVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    pbVar7 = &local_50;
  }
  else {
LAB_0028d133:
    std::operator+(&local_d0,&local_b0,&local_90);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      lVar3 = plVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    pbVar7 = &local_d0;
  }
  puVar4 = (undefined1 *)(&(pbVar7->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &pbVar7->field_2) {
    operator_delete(puVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
LAB_0028d3dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  sVar5 = __return_storage_ptr__->_M_string_length;
  if (sVar5 != 0) {
    pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar13 = 0;
    do {
      cVar2 = pcVar6[sVar13];
      if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        pcVar6[sVar13] = cVar2 + -0x20;
      }
      sVar13 = sVar13 + 1;
    } while (sVar5 != sVar13);
  }
  std::operator+(&local_f0,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleAlias(&local_d0,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0.field_2._8_8_ = plVar9[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0.field_2._8_8_ = plVar9[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_f0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  std::string name = NamePrefixedWithNestedTypes(descriptor, "_");
  ToUpper(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = "_" + name;
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}